

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O0

int SetAllPWMsLIRMIA3(LIRMIA3 *pLIRMIA3,int *pws)

{
  int iVar1;
  uchar local_84;
  int local_80;
  int local_7c;
  uchar local_78;
  int local_74;
  int local_70;
  uchar local_6c;
  int local_68;
  int local_64;
  uchar local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int M4;
  int M3;
  int M2;
  int M1;
  int pws_tmp [4];
  int channel;
  int *pws_local;
  LIRMIA3 *pLIRMIA3_local;
  
  _M2 = *(undefined8 *)pws;
  pws_tmp._0_8_ = *(undefined8 *)(pws + 2);
  for (pws_tmp[3] = 0; pws_tmp[3] < 4; pws_tmp[3] = pws_tmp[3] + 1) {
    if (pLIRMIA3->bProportionalPWs[pws_tmp[3]] == 0) {
      (&M2)[pws_tmp[3]] =
           (int)(pLIRMIA3->CoefPWs[pws_tmp[3]] * (double)((&M2)[pws_tmp[3]] + -0x5dc)) + 0x5dc;
    }
    else {
      (&M2)[pws_tmp[3]] =
           (int)(pLIRMIA3->CoefPWs[pws_tmp[3]] * (double)((&M2)[pws_tmp[3]] + -0x5dc));
      if ((&M2)[pws_tmp[3]] < 0) {
        (&M2)[pws_tmp[3]] =
             pLIRMIA3->MidPWs[pws_tmp[3]] +
             ((&M2)[pws_tmp[3]] * (pLIRMIA3->MinPWs[pws_tmp[3]] - pLIRMIA3->MidPWs[pws_tmp[3]])) /
             -500;
      }
      else {
        (&M2)[pws_tmp[3]] =
             pLIRMIA3->MidPWs[pws_tmp[3]] +
             ((&M2)[pws_tmp[3]] * (pLIRMIA3->MaxPWs[pws_tmp[3]] - pLIRMIA3->MidPWs[pws_tmp[3]])) /
             500;
      }
    }
    if ((&M2)[pws_tmp[3]] < pLIRMIA3->MaxPWs[pws_tmp[3]]) {
      local_4c = (&M2)[pws_tmp[3]];
    }
    else {
      local_4c = pLIRMIA3->MaxPWs[pws_tmp[3]];
    }
    if (pLIRMIA3->MinPWs[pws_tmp[3]] < local_4c) {
      if ((&M2)[pws_tmp[3]] < pLIRMIA3->MaxPWs[pws_tmp[3]]) {
        local_50 = (&M2)[pws_tmp[3]];
      }
      else {
        local_50 = pLIRMIA3->MaxPWs[pws_tmp[3]];
      }
      local_54 = local_50;
    }
    else {
      local_54 = pLIRMIA3->MinPWs[pws_tmp[3]];
    }
    (&M2)[pws_tmp[3]] = local_54;
  }
  local_5c = ((M2 + -1000) * 0xff) / 1000;
  local_68 = ((M1 + -1000) * 0xff) / 1000;
  local_74 = ((pws_tmp[0] + -1000) * 0xff) / 1000;
  local_80 = ((pws_tmp[1] + -1000) * 0xff) / 1000;
  local_58 = local_5c;
  if (0xfe < local_5c) {
    local_58 = 0xff;
  }
  if (local_58 < 1) {
    local_60 = '\0';
  }
  else {
    if (0xfe < local_5c) {
      local_5c = 0xff;
    }
    local_60 = (uchar)local_5c;
  }
  local_64 = local_68;
  if (0xfe < local_68) {
    local_64 = 0xff;
  }
  if (local_64 < 1) {
    local_6c = '\0';
  }
  else {
    if (0xfe < local_68) {
      local_68 = 0xff;
    }
    local_6c = (uchar)local_68;
  }
  local_70 = local_74;
  if (0xfe < local_74) {
    local_70 = 0xff;
  }
  if (local_70 < 1) {
    local_78 = '\0';
  }
  else {
    if (0xfe < local_74) {
      local_74 = 0xff;
    }
    local_78 = (uchar)local_74;
  }
  local_7c = local_80;
  if (0xfe < local_80) {
    local_7c = 0xff;
  }
  if (local_7c < 1) {
    local_84 = '\0';
  }
  else {
    if (0xfe < local_80) {
      local_80 = 0xff;
    }
    local_84 = (uchar)local_80;
  }
  iVar1 = WriteDataLIRMIA3(pLIRMIA3,local_60,local_6c,local_78,local_84);
  if (iVar1 == 0) {
    for (pws_tmp[3] = 0; pws_tmp[3] < 4; pws_tmp[3] = pws_tmp[3] + 1) {
      pLIRMIA3->LastPWs[pws_tmp[3]] = (&M2)[pws_tmp[3]];
    }
    pLIRMIA3_local._4_4_ = 0;
  }
  else {
    pLIRMIA3_local._4_4_ = 1;
  }
  return pLIRMIA3_local._4_4_;
}

Assistant:

inline int SetAllPWMsLIRMIA3(LIRMIA3* pLIRMIA3, int* pws)
{
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_LIRMIA3];
	int M1 = 0, M2 = 0, M3 = 0, M4 = 0;

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		if (pLIRMIA3->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pLIRMIA3->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_LIRMIA3));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pLIRMIA3->MidPWs[channel]+pws_tmp[channel]*(pLIRMIA3->MaxPWs[channel]-pLIRMIA3->MidPWs[channel])
				/(DEFAULT_MAX_PW_LIRMIA3-DEFAULT_MID_PW_LIRMIA3);
			else
				pws_tmp[channel] = pLIRMIA3->MidPWs[channel]+pws_tmp[channel]*(pLIRMIA3->MinPWs[channel]-pLIRMIA3->MidPWs[channel])
				/(DEFAULT_MIN_PW_LIRMIA3-DEFAULT_MID_PW_LIRMIA3);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_LIRMIA3+(int)(pLIRMIA3->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_LIRMIA3));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pLIRMIA3->MaxPWs[channel]), pLIRMIA3->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3), DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3);

		//// The requested PWM is only applied if it is slightly different from the current value.
		//if (abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]) < pLIRMIA3->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pLIRMIA3->LastPWs[channel], abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]), pLIRMIA3->ThresholdPWs[channel]);
	}

	//M1 = (pws_tmp[0]-pLIRMIA3->MinPWs[0])*255/(pLIRMIA3->MaxPWs[0]-pLIRMIA3->MinPWs[0]); 
	//M2 = (pws_tmp[1]-pLIRMIA3->MinPWs[1])*255/(pLIRMIA3->MaxPWs[1]-pLIRMIA3->MinPWs[1]); 
	//M3 = (pws_tmp[2]-pLIRMIA3->MinPWs[2])*255/(pLIRMIA3->MaxPWs[2]-pLIRMIA3->MinPWs[2]); 
	//M4 = (pws_tmp[3]-pLIRMIA3->MinPWs[3])*255/(pLIRMIA3->MaxPWs[3]-pLIRMIA3->MinPWs[3]);
	M1 = (pws_tmp[0]-1000)*255/1000; 
	M2 = (pws_tmp[1]-1000)*255/1000; 
	M3 = (pws_tmp[2]-1000)*255/1000; 
	M4 = (pws_tmp[3]-1000)*255/1000;

	M1 = max(min(M1, 255), 0);
	M2 = max(min(M2, 255), 0);
	M3 = max(min(M3, 255), 0);
	M4 = max(min(M4, 255), 0);

	if (WriteDataLIRMIA3(pLIRMIA3, (unsigned char)M1, (unsigned char)M2, (unsigned char)M3, (unsigned char)M4) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		//// The requested PWM should have been only applied if it was slightly different from the current value.
		//if (abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]) < pLIRMIA3->ThresholdPWs[channel]) continue;

		// Update last known value.
		pLIRMIA3->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}